

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correction.hpp
# Opt level: O0

void MGARD::compute_load_vector_vertical<float>
               (float *load_v_buffer,float *nodal_buffer,float *coeff_buffer,size_t n1_nodal,
               size_t n1_coeff,size_t stride,float h,int batchsize)

{
  int j_3;
  int j_2;
  int j_1;
  int i;
  int j;
  float *load_v_pos;
  float *coeff_pos;
  float *nodal_pos;
  float ch;
  float bh;
  float ah;
  float h_local;
  size_t stride_local;
  size_t n1_coeff_local;
  size_t n1_nodal_local;
  float *coeff_buffer_local;
  float *nodal_buffer_local;
  float *load_v_buffer_local;
  
  for (j = 0; j < batchsize; j = j + 1) {
    load_v_buffer[j] =
         nodal_buffer[stride + (long)j] * 0.083333336 +
         coeff_buffer[j] * 0.5 + (nodal_buffer[j] * 0.8333333) / 2.0;
  }
  load_v_pos = load_v_buffer + batchsize;
  nodal_pos = nodal_buffer + stride;
  coeff_pos = coeff_buffer + stride;
  for (i = 1; (ulong)(long)i < n1_coeff; i = i + 1) {
    for (j_1 = 0; j_1 < batchsize; j_1 = j_1 + 1) {
      load_v_pos[j_1] =
           nodal_pos[j_1] * 0.8333333 +
           (nodal_pos[(long)j_1 - stride] + nodal_pos[(long)j_1 + stride]) * 0.083333336 +
           (coeff_pos[(long)j_1 - stride] + coeff_pos[j_1]) * 0.5;
    }
    load_v_pos = load_v_pos + batchsize;
    nodal_pos = nodal_pos + stride;
    coeff_pos = coeff_pos + stride;
  }
  for (j_2 = 0; j_2 < batchsize; j_2 = j_2 + 1) {
    load_v_pos[j_2] =
         nodal_pos[(long)j_2 - stride] * 0.083333336 + coeff_pos[(long)j_2 - stride] * 0.5 +
         (nodal_pos[j_2] * 0.8333333) / 2.0;
  }
  if (n1_nodal == n1_coeff + 2) {
    for (j_3 = 0; j_3 < batchsize; j_3 = j_3 + 1) {
      load_v_pos[(long)batchsize + (long)j_3] = 0.0;
    }
  }
  return;
}

Assistant:

void compute_load_vector_vertical(T * load_v_buffer, const T * nodal_buffer, const T * coeff_buffer, size_t n1_nodal, size_t n1_coeff, size_t stride, T h, int batchsize){
    // T ah = h * 0.25; // derived constant in the formula
    // T ah = alpha * h;   // 1/12
    // T bh = beta * h;    // 1/2
    // T ch = gamma * h;   // 5/6
    // eliminate h for efficiency
    T ah = alpha;   // 1/12
    T bh = beta;    // 1/2
    T ch = gamma;   // 5/6
    T const * nodal_pos = nodal_buffer;
    T const * coeff_pos = coeff_buffer;
    T * load_v_pos = load_v_buffer;
    // first nodal value
    for(int j=0; j<batchsize; j++){
        // load_v_pos[j] = coeff_pos[j] * ah;
        load_v_pos[j] = nodal_pos[j] * ch / 2 + coeff_pos[j] * bh + nodal_pos[stride + j] * ah;
    }
    load_v_pos += batchsize;
    nodal_pos += stride;
    coeff_pos += stride;
    for(int i=1; i<n1_coeff; i++){
        for(int j=0; j<batchsize; j++){
            // load_v_pos[j] = (coeff_pos[-stride + j] + coeff_pos[j]) * ah;
            load_v_pos[j] = (nodal_pos[j - stride] + nodal_pos[j + stride]) * ah + (coeff_pos[j - stride] + coeff_pos[j]) * bh + nodal_pos[j] * ch;
        }
        load_v_pos += batchsize;
        nodal_pos += stride;
        coeff_pos += stride;
    }
    // last nodal value
    for(int j=0; j<batchsize; j++){
        // load_v_pos[j] = coeff_pos[-stride + j] * ah;
        load_v_pos[j] = nodal_pos[j - stride] * ah + coeff_pos[j - stride] * bh + nodal_pos[j] * ch / 2;
    }
    // if next n is even, load_v_buffer[n_nodal - 1] = 0
    if(n1_nodal == n1_coeff + 2){
        load_v_pos += batchsize;
        for(int j=0; j<batchsize; j++){
            load_v_pos[j] = 0;
        }
    }
}